

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O0

void __thiscall ADL_JavaOPL3::OPL3::initChannels2op(OPL3 *this)

{
  uint baseAddress_00;
  Channel2op *pCVar1;
  double local_40;
  uint local_20;
  int baseAddress;
  int channelNumber;
  int array;
  double startvol;
  OPL3 *this_local;
  
  memset(this->channels2op,0,0x90);
  local_40 = 0.70710678118;
  if ((this->FullPan & 1U) == 0) {
    local_40 = 1.0;
  }
  for (baseAddress = 0; baseAddress < 2; baseAddress = baseAddress + 1) {
    for (local_20 = 0; (int)local_20 < 3; local_20 = local_20 + 1) {
      baseAddress_00 = baseAddress << 8 | local_20;
      pCVar1 = (Channel2op *)operator_new(0x60);
      Channel2op::Channel2op
                (pCVar1,baseAddress_00,local_40,this->operators[baseAddress][(int)local_20],
                 this->operators[baseAddress][(long)(int)local_20 + 3]);
      this->channels2op[baseAddress][(int)local_20] = pCVar1;
      pCVar1 = (Channel2op *)operator_new(0x60);
      Channel2op::Channel2op
                (pCVar1,baseAddress_00 + 3,local_40,
                 this->operators[baseAddress][(long)(int)local_20 + 8],
                 this->operators[baseAddress][(long)(int)local_20 + 0xb]);
      this->channels2op[baseAddress][(long)(int)local_20 + 3] = pCVar1;
      pCVar1 = (Channel2op *)operator_new(0x60);
      Channel2op::Channel2op
                (pCVar1,baseAddress_00 + 6,local_40,
                 this->operators[baseAddress][(long)(int)local_20 + 0x10],
                 this->operators[baseAddress][(long)(int)local_20 + 0x13]);
      this->channels2op[baseAddress][(int)(local_20 + 6)] = pCVar1;
    }
  }
  return;
}

Assistant:

void OPL3::initChannels2op() {
    // The YMF262 has 18 2-op channels.
    // Each 2-op channel can be at a serial or parallel operator configuration:
    memset(channels2op, 0, sizeof(channels2op));
	double startvol = FullPan ? CENTER_PANNING_POWER : 1;
    for(int array=0; array<2; array++)
        for(int channelNumber=0; channelNumber<3; channelNumber++) {
            int baseAddress = (array<<8) | channelNumber;
            // Channels 1, 2, 3 -> Operator offsets 0x0,0x3; 0x1,0x4; 0x2,0x5
            channels2op[array][channelNumber]   = new Channel2op(baseAddress, startvol, operators[array][channelNumber], operators[array][channelNumber+0x3]);
            // Channels 4, 5, 6 -> Operator offsets 0x8,0xB; 0x9,0xC; 0xA,0xD
            channels2op[array][channelNumber+3] = new Channel2op(baseAddress+3, startvol, operators[array][channelNumber+0x8], operators[array][channelNumber+0xB]);
            // Channels 7, 8, 9 -> Operators 0x10,0x13; 0x11,0x14; 0x12,0x15
            channels2op[array][channelNumber+6] = new Channel2op(baseAddress+6, startvol, operators[array][channelNumber+0x10], operators[array][channelNumber+0x13]);
        }   
}